

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O3

bool __thiscall Time::operator==(Time *this,Time *other)

{
  int iVar1;
  
  iVar1 = memcmp(this,other,0x22);
  return iVar1 == 0;
}

Assistant:

bool Time::operator==(const Time& other) const
{
  return sec == other.sec &&
    min == other.min &&
    hour == other.hour &&
    day == other.day &&
    month == other.month &&
    year == other.year &&
    wday == other.wday &&
    yday == other.yday &&
    dst == other.dst &&
    utc == other.utc;
}